

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

void __thiscall SharedDirectory::cancel_reserved_file(SharedDirectory *this,string *f)

{
  bool bVar1;
  Error *this_00;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator it;
  string *f_local;
  SharedDirectory *this_local;
  
  it._M_node = (_Base_ptr)f;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&this->pending_files,f);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&this->pending_files);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->(&local_20);
    this->remaining_space = ppVar2->second + this->remaining_space;
    std::
    map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)&this->pending_files,(iterator)local_20._M_node);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File was not reserved");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void SharedDirectory::cancel_reserved_file(const std::string &f) {
  auto it = pending_files.find(f);
  if (it == pending_files.end()) {
    throw Error("File was not reserved");
  }
  remaining_space += it->second;
  pending_files.erase(it);
}